

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicLattice.cpp
# Opt level: O2

int __thiscall
CubicLattice::neighbour(CubicLattice *this,int vertexIndex,string *direction,int sign)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  cartesian4 local_208;
  string errorMessage;
  cartesian4 errorCoord;
  string errorDir;
  ostringstream stream;
  
  if ((sign != -1) && (sign != 1)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Sign must be either 1 or -1.");
LAB_0012add9:
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = std::operator==(direction,"x");
  if (!bVar2) {
    bVar2 = std::operator==(direction,"y");
    if (!bVar2) {
      bVar2 = std::operator==(direction,"z");
      if (!bVar2) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar4,"Direction must be one of \'x\', \'y\' or \'z\'.");
        goto LAB_0012add9;
      }
    }
  }
  local_208 = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  iVar5 = local_208.z;
  iVar6 = local_208.x;
  if (local_208.w == 1) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Cubic lattice doesn\'t contain w=0 vertices.");
    goto LAB_0012add9;
  }
  uVar7 = local_208.y;
  bVar2 = std::operator==(direction,"x");
  if (bVar2) {
    iVar6 = iVar6 + sign;
    local_208.x = iVar6;
  }
  else {
    bVar2 = std::operator==(direction,"y");
    if (bVar2) {
      uVar7 = uVar7 + sign;
      local_208.y = uVar7;
    }
    else {
      bVar2 = std::operator==(direction,"z");
      if (bVar2) {
        iVar5 = iVar5 + sign;
        local_208.z = iVar5;
      }
    }
  }
  if ((((-1 < iVar6) && (uVar1 = (this->super_Lattice).l, iVar6 < (int)uVar1)) && (-1 < (int)uVar7))
     && (((uVar7 < uVar1 && (-1 < iVar5)) && (iVar5 < (int)uVar1)))) {
    iVar6 = Lattice::coordinateToIndex(&this->super_Lattice,&local_208);
    return iVar6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  errorCoord = Lattice::indexToCoordinate(&this->super_Lattice,vertexIndex);
  errorDir._M_dataplus._M_p = (pointer)&errorDir.field_2;
  errorDir._M_string_length = 0;
  errorDir.field_2._M_local_buf[0] = '\0';
  if (sign == -1) {
    std::operator+(&errorMessage,"-",direction);
  }
  else {
    if (sign != 1) goto LAB_0012ad39;
    std::operator+(&errorMessage,"+",direction);
  }
  std::__cxx11::string::operator=((string *)&errorDir,(string *)&errorMessage);
  std::__cxx11::string::~string((string *)&errorMessage);
LAB_0012ad39:
  poVar3 = std::operator<<((ostream *)&stream,"CubicLattice::neighbour, ");
  poVar3 = std::operator<<(poVar3,(string *)&errorDir);
  poVar3 = std::operator<<(poVar3," neighbour of ");
  poVar3 = operator<<(poVar3,&errorCoord);
  std::operator<<(poVar3," is outside the lattice.");
  std::__cxx11::stringbuf::str();
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,(string *)&errorMessage);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = coordinate.x + sign;
        }
        else if (direction == "y")
        {
            coordinate.y = coordinate.y + sign;
        }
        else if (direction == "z")
        {
            coordinate.z = coordinate.z + sign;
        }
    }
    if (coordinate.x < 0 || coordinate.x >= l || coordinate.y < 0 || coordinate.y >= l || coordinate.z < 0 || coordinate.z >= l)
    {
        std::ostringstream stream;
        cartesian4 errorCoord = indexToCoordinate(vertexIndex);
        std::string errorDir;
        if (sign == 1)
        {
            errorDir = "+" + direction;
        }
        else if (sign == -1)
        {
            errorDir = "-" + direction;
        }
        stream << "CubicLattice::neighbour, " << errorDir << " neighbour of " << errorCoord << " is outside the lattice.";
        std::string errorMessage = stream.str();
        throw std::invalid_argument(errorMessage);
    }
    else
    {
        return coordinateToIndex(coordinate);
    }
}